

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

bool __thiscall spvtools::opt::Function::IsRecursive(Function *this)

{
  IRContext *this_00;
  bool bVar1;
  ProcessFunction mark_visited;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  
  this_00 = *(IRContext **)
             (*(long *)((long)(((this->blocks_).
                                super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                              super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                              ._M_t + 8) + 0x20);
  local_98._8_8_ = 0;
  pcStack_80 = std::
               _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/function.cpp:241:45)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<bool_(spvtools::opt::Function_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/function.cpp:241:45)>
             ::_M_manager;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_98._M_unused._M_object = this;
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map(&local_78,0);
  IRContext::AddCalls(this_00,this,
                      (queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                       *)&local_78);
  bVar1 = IRContext::ProcessCallTreeFromRoots
                    (this_00,(ProcessFunction *)&local_98,
                     (queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&local_78);
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_78);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  return bVar1;
}

Assistant:

bool Function::IsRecursive() const {
  IRContext* ctx = blocks_.front()->GetLabel()->context();
  IRContext::ProcessFunction mark_visited = [this](Function* fp) {
    return fp == this;
  };

  // Process the call tree from all of the function called by |this|.  If it get
  // back to |this|, then we have a recursive function.
  std::queue<uint32_t> roots;
  ctx->AddCalls(this, &roots);
  return ctx->ProcessCallTreeFromRoots(mark_visited, &roots);
}